

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpauseanimation.cpp
# Opt level: O0

void __thiscall QPauseAnimation::setDuration(QPauseAnimation *this,int msecs)

{
  parameter_type pVar1;
  QPauseAnimationPrivate *this_00;
  int in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  QPauseAnimationPrivate *d;
  undefined4 in_stack_00000020;
  char *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  int iVar2;
  QMessageLogger *in_stack_ffffffffffffffc0;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI < 0) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffc0,in_RDI,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8)
    ;
    QMessageLogger::warning
              (&local_28,"QPauseAnimation::setDuration: cannot set a negative duration");
  }
  else {
    this_00 = d_func((QPauseAnimation *)0x680c12);
    QObjectCompatProperty<QPauseAnimationPrivate,_int,_&QPauseAnimationPrivate::_qt_property_duration_offset,_&QPauseAnimationPrivate::setDuration,_nullptr,_nullptr>
    ::removeBindingUnlessInWrapper
              ((QObjectCompatProperty<QPauseAnimationPrivate,_int,_&QPauseAnimationPrivate::_qt_property_duration_offset,_&QPauseAnimationPrivate::setDuration,_nullptr,_nullptr>
                *)this_00);
    iVar2 = in_ESI;
    pVar1 = QPropertyData<int>::valueBypassingBindings
                      (&(this_00->duration).super_QPropertyData<int>);
    if (iVar2 != pVar1) {
      QPropertyData<int>::setValueBypassingBindings
                (&(this_00->duration).super_QPropertyData<int>,in_ESI);
      QObjectCompatProperty<QPauseAnimationPrivate,_int,_&QPauseAnimationPrivate::_qt_property_duration_offset,_&QPauseAnimationPrivate::setDuration,_nullptr,_nullptr>
      ::notify((QObjectCompatProperty<QPauseAnimationPrivate,_int,_&QPauseAnimationPrivate::_qt_property_duration_offset,_&QPauseAnimationPrivate::setDuration,_nullptr,_nullptr>
                *)CONCAT44(msecs,in_stack_00000020));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPauseAnimation::setDuration(int msecs)
{
    if (msecs < 0) {
        qWarning("QPauseAnimation::setDuration: cannot set a negative duration");
        return;
    }
    Q_D(QPauseAnimation);

    d->duration.removeBindingUnlessInWrapper();
    if (msecs != d->duration.valueBypassingBindings()) {
        d->duration.setValueBypassingBindings(msecs);
        d->duration.notify();
    }
}